

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free.c
# Opt level: O2

void mi_free_block_local(mi_page_t *page,mi_block_t *block,_Bool track_stats,_Bool check_full)

{
  uint16_t *puVar1;
  byte bVar2;
  mi_heap_t *heap;
  uintptr_t uVar3;
  mi_page_queue_t *pmVar4;
  ulong uVar5;
  undefined7 in_register_00000009;
  mi_page_t *page_00;
  
  page_00 = (mi_page_t *)CONCAT71(in_register_00000009,check_full);
  block->next = (mi_encoded_t)page->local_free;
  page->local_free = block;
  puVar1 = &page->used;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 != 0) {
    if ((track_stats) && (((page->flags).full_aligned & 1) != 0)) {
      bVar2 = (page->flags).full_aligned;
      if ((bVar2 & 1) == 0) {
        return;
      }
      heap = (mi_heap_t *)page->xheap;
      (page->flags).full_aligned = bVar2 & 0xfe;
      pmVar4 = mi_heap_page_queue_of(heap,page);
      (page->flags).full_aligned = bVar2;
      mi_page_queue_enqueue_from_ex(pmVar4,heap->pages + 0x4a,SUB81(page,0),page_00);
      return;
    }
    return;
  }
  (page->flags).full_aligned = (page->flags).full_aligned & 0xfd;
  pmVar4 = mi_page_queue_of(page);
  if (((pmVar4->block_size < 0x10001) && (pmVar4->last == page)) && (pmVar4->first == page)) {
    bVar2 = 8;
    if (page->block_size < 0x2001) {
      bVar2 = 0x20;
    }
    page->field_0xf = page->field_0xf & 1 | bVar2;
    uVar3 = page->xheap;
    uVar5 = (long)((long)pmVar4 + (-0x500 - uVar3)) / 0x18;
    if (uVar5 < *(ulong *)(uVar3 + 200)) {
      *(ulong *)(uVar3 + 200) = uVar5;
    }
    if (*(ulong *)(uVar3 + 0xd0) < uVar5) {
      *(ulong *)(uVar3 + 0xd0) = uVar5;
    }
    return;
  }
  _mi_page_free(page,pmVar4,false);
  return;
}

Assistant:

static inline void mi_free_block_local(mi_page_t* page, mi_block_t* block, bool track_stats, bool check_full)
{
  // checks
  if mi_unlikely(mi_check_is_double_free(page, block)) return;
  mi_check_padding(page, block);
  if (track_stats) { mi_stat_free(page, block); }
  #if (MI_DEBUG>0) && !MI_TRACK_ENABLED  && !MI_TSAN && !MI_GUARDED
  if (!mi_page_is_huge(page)) {   // huge page content may be already decommitted
    memset(block, MI_DEBUG_FREED, mi_page_block_size(page));
  }
  #endif
  if (track_stats) { mi_track_free_size(block, mi_page_usable_size_of(page, block)); } // faster then mi_usable_size as we already know the page and that p is unaligned

  // actual free: push on the local free list
  mi_block_set_next(page, block, page->local_free);
  page->local_free = block;
  if mi_unlikely(--page->used == 0) {
    _mi_page_retire(page);
  }